

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parametric.cxx
# Opt level: O1

string * __thiscall
Parametric::getAllParameters_abi_cxx11_(string *__return_storage_ptr__,Parametric *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  pointer pbVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  string indent;
  long *local_d8;
  long local_c8;
  undefined8 uStack_c0;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  ulong *local_98;
  long local_90;
  ulong local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  parametricOutputIndent = parametricOutputIndent + 1;
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  if (parametricOutputIndent != 0) {
    uVar7 = 0;
    do {
      std::__cxx11::string::append((char *)&local_70);
      uVar7 = uVar7 + 1;
    } while (uVar7 < parametricOutputIndent);
  }
  pbVar6 = (this->parametricStrings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78 = paVar1;
  if ((this->parametricStrings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar6) {
    uVar8 = 0;
    uVar9 = 1;
    do {
      parametricOutputLineEnd = true;
      std::operator+(&local_50,&local_70,pbVar6 + uVar8);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      puVar5 = (ulong *)(plVar3 + 2);
      if ((ulong *)*plVar3 == puVar5) {
        local_88 = *puVar5;
        uStack_80 = (undefined4)plVar3[3];
        uStack_7c = *(undefined4 *)((long)plVar3 + 0x1c);
        local_98 = &local_88;
      }
      else {
        local_88 = *puVar5;
        local_98 = (ulong *)*plVar3;
      }
      local_90 = plVar3[1];
      *plVar3 = (long)puVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      (*this->_vptr_Parametric[3])
                (&local_b8,this,
                 (this->parametricStrings).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8);
      uVar8 = 0xf;
      if (local_98 != &local_88) {
        uVar8 = local_88;
      }
      if (uVar8 < (ulong)(local_b0 + local_90)) {
        uVar8 = 0xf;
        if (local_b8 != local_a8) {
          uVar8 = local_a8[0];
        }
        if (uVar8 < (ulong)(local_b0 + local_90)) goto LAB_0013cc94;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98);
      }
      else {
LAB_0013cc94:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_b8);
      }
      plVar3 = puVar4 + 2;
      if ((long *)*puVar4 == plVar3) {
        local_c8 = *plVar3;
        uStack_c0 = puVar4[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar3;
        local_d8 = (long *)*puVar4;
      }
      *puVar4 = plVar3;
      puVar4[1] = 0;
      *(undefined1 *)plVar3 = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d8);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (parametricOutputLineEnd == true) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        parametricOutputLineEnd = false;
      }
      pbVar6 = (this->parametricStrings).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar9 < (ulong)((long)(this->parametricStrings).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5);
      uVar8 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar2);
  }
  parametricOutputIndent = parametricOutputIndent - 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string Parametric::getAllParameters() const
{
	++parametricOutputIndent;
	string params;
	string indent = "";
	for (uint i=0; i<parametricOutputIndent; ++i)
		indent += "\t";
	for (uint i=0; i<parametricStrings.size(); ++i) {
		parametricOutputLineEnd = true;
		params += indent + parametricStrings[i] + ": " + getParameter( parametricStrings[i] );
		if (parametricOutputLineEnd) {
			params += "\n";
			parametricOutputLineEnd = false;
		}
	}
	--parametricOutputIndent;
	return params;
}